

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

void __thiscall
Namespace<false>::AddFeature
          (Namespace<false> *this,feature_value v,feature_index i,char *feature_name)

{
  if ((v == 0.0) && (!NAN(v))) {
    return;
  }
  features::push_back(this->ftrs,v,i);
  this->feature_count = this->feature_count + 1;
  return;
}

Assistant:

void AddFeature(feature_value v, feature_index i, const char* feature_name)
  {
    // filter out 0-values
    if (v == 0)
      return;

    ftrs->push_back(v, i);
    feature_count++;

    if (audit)
      ftrs->space_names.push_back(audit_strings_ptr(new audit_strings(name, feature_name)));
  }